

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

WasmOp __thiscall Wasm::WasmBinaryReader::ReadOpCode(WasmBinaryReader *this)

{
  byte *pbVar1;
  bool bVar2;
  WasmOp op;
  WasmBinaryReader *this_local;
  
  CheckBytesLeft(this,1);
  pbVar1 = this->m_pc;
  this->m_pc = pbVar1 + 1;
  this_local._6_2_ = (WasmOp)*pbVar1;
  (this->m_funcState).count = (this->m_funcState).count + 1;
  switch(this_local._6_2_) {
  case prefixTracing:
    this_local._6_2_ =
         ReadPrefixedOpCode(this,this_local._6_2_,false,L"Tracing opcodes not allowed");
    break;
  default:
    break;
  case prefixNumeric:
    bVar2 = WasmNontrapping::IsEnabled();
    this_local._6_2_ =
         ReadPrefixedOpCode(this,this_local._6_2_,bVar2,
                            L"WebAssembly nontrapping float-to-int conversion support is not enabled"
                           );
    break;
  case prefixSimd:
    bVar2 = Simd::IsEnabled();
    this_local._6_2_ =
         ReadPrefixedOpCode(this,this_local._6_2_,bVar2,L"WebAssembly Simd support is not enabled");
    break;
  case prefixThreads:
    bVar2 = Threads::IsEnabled();
    this_local._6_2_ =
         ReadPrefixedOpCode(this,this_local._6_2_,bVar2,
                            L"WebAssembly Threads support is not enabled");
  }
  return this_local._6_2_;
}

Assistant:

WasmOp WasmBinaryReader::ReadOpCode()
{
    CheckBytesLeft(1);
    WasmOp op = (WasmOp)*m_pc++;
    ++m_funcState.count;

    switch (op)
    {
#define WASM_PREFIX(name, value, imp, errorMsg) \
    case prefix##name: \
        return ReadPrefixedOpCode(op, imp, _u(errorMsg));
#include "WasmBinaryOpCodes.h"
    }

    return op;
}